

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void erase_suite::erase_beginning(void)

{
  map_view<int,_int,_4UL,_std::less<int>_> *this;
  initializer_list<vista::pair<int,_int>_> __l;
  initializer_list<vista::pair<int,_int>_> __l_00;
  initializer_list<vista::pair<int,_int>_> __l_01;
  initializer_list<vista::pair<int,_int>_> __l_02;
  allocator_type local_89;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect_1;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  this = &array.super_map_view<int,_int,_4UL,_std::less<int>_>;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .head = (pointer)&array;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .tail = (pointer)this;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
       member.head;
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert(this,(value_type)0x10000000b);
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert(this,(value_type)0x200000016);
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert(this,(value_type)0x300000021);
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert(this,(value_type)0x40000002c);
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  __l._M_len = 4;
  __l._M_array = (iterator)&expect_1;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect,__l,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x16b,"void erase_suite::erase_beginning()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  vista::map_array<int,_int,_4UL,_std::less<int>_>::erase
            (&array,array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                    super_span<vista::pair<int,_int>,_4UL>.member.head);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000016;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x300000021;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40000002c;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&expect;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect_1,__l_00,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x172,"void erase_suite::erase_beginning()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect_1.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  vista::map_array<int,_int,_4UL,_std::less<int>_>::erase
            (&array,array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                    super_span<vista::pair<int,_int>,_4UL>.member.head);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000021;
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x40000002c;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&expect;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect_1,__l_01,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x178,"void erase_suite::erase_beginning()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect_1.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  vista::map_array<int,_int,_4UL,_std::less<int>_>::erase
            (&array,array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                    super_span<vista::pair<int,_int>,_4UL>.member.head);
  expect.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x40000002c;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&expect;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&expect_1,__l_02,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x17e,"void erase_suite::erase_beginning()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )expect_1.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect_1.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  vista::map_array<int,_int,_4UL,_std::less<int>_>::erase
            (&array,array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                    super_span<vista::pair<int,_int>,_4UL>.member.head);
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expect_1.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x184,"void erase_suite::erase_beginning()",
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head,
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )0x0,(__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
                    )0x0);
  std::_Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::~_Vector_base
            (&expect_1.
              super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}